

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O2

bool __thiscall
QHttpSocketEngine::leaveMulticastGroup
          (QHttpSocketEngine *this,QHostAddress *param_1,QNetworkInterface *param_2)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d._0_4_ = 2;
  local_38.size._4_4_ = 0;
  local_38._4_8_ = 0;
  local_38._12_8_ = 0;
  local_20 = "default";
  QMessageLogger::warning((char *)&local_38,"Operation is not supported");
  latin1.m_data = "Unsupported socket operation";
  latin1.m_size = 0x1c;
  QString::QString((QString *)&local_38,latin1);
  QAbstractSocketEngine::setError
            ((QAbstractSocketEngine *)this,UnsupportedSocketOperationError,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::leaveMulticastGroup(const QHostAddress &,
                                            const QNetworkInterface &)
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return false;
}